

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

int ll_module(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *k;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  lua_Debug ar;
  lua_Debug lStack_98;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = lua_gettop(L);
  lua_getfield(L,-10000,"_LOADED");
  lua_getfield(L,iVar1 + 1,k);
  iVar2 = lua_type(L,-1);
  if (iVar2 != 5) {
    lua_settop(L,-2);
    pcVar3 = luaL_findtable(L,-0x2712,k,1);
    if (pcVar3 != (char *)0x0) {
      iVar1 = luaL_error(L,"name conflict for module \'%s\'",k);
      return iVar1;
    }
    lua_pushvalue(L,-1);
    lua_setfield(L,iVar1 + 1,k);
  }
  lua_getfield(L,-1,"_NAME");
  iVar2 = lua_type(L,-1);
  lua_settop(L,-2);
  if (iVar2 == 0) {
    lua_pushvalue(L,-1);
    lua_setfield(L,-2,"_M");
    lua_pushstring(L,k);
    lua_setfield(L,-2,"_NAME");
    pcVar4 = strrchr(k,0x2e);
    pcVar3 = pcVar4 + 1;
    if (pcVar4 == (char *)0x0) {
      pcVar3 = k;
    }
    lua_pushlstring(L,k,(long)pcVar3 - (long)k);
    lua_setfield(L,-2,"_PACKAGE");
  }
  lua_pushvalue(L,-1);
  iVar2 = lua_getstack(L,1,&lStack_98);
  if (iVar2 != 0) {
    iVar2 = lua_getinfo(L,"f",&lStack_98);
    if (iVar2 != 0) {
      iVar2 = lua_iscfunction(L,-1);
      if (iVar2 == 0) goto LAB_00119eb4;
    }
  }
  luaL_error(L,"\'module\' not called from a Lua function");
LAB_00119eb4:
  lua_pushvalue(L,-2);
  lua_setfenv(L,-2);
  lua_settop(L,-2);
  if (1 < iVar1) {
    iVar2 = 2;
    do {
      lua_pushvalue(L,iVar2);
      lua_pushvalue(L,-2);
      lua_call(L,1,0);
      bVar5 = iVar2 != iVar1;
      iVar2 = iVar2 + 1;
    } while (bVar5);
  }
  return 0;
}

Assistant:

static int ll_module (lua_State *L) {
  const char *modname = luaL_checkstring(L, 1);
  int loaded = lua_gettop(L) + 1;  /* index of _LOADED table */
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, loaded, modname);  /* get _LOADED[modname] */
  if (!lua_istable(L, -1)) {  /* not found? */
    lua_pop(L, 1);  /* remove previous result */
    /* try global variable (and create one if it does not exist) */
    if (luaL_findtable(L, LUA_GLOBALSINDEX, modname, 1) != NULL)
      return luaL_error(L, "name conflict for module " LUA_QS, modname);
    lua_pushvalue(L, -1);
    lua_setfield(L, loaded, modname);  /* _LOADED[modname] = new table */
  }
  /* check whether table already has a _NAME field */
  lua_getfield(L, -1, "_NAME");
  if (!lua_isnil(L, -1))  /* is table an initialized module? */
    lua_pop(L, 1);
  else {  /* no; initialize it */
    lua_pop(L, 1);
    modinit(L, modname);
  }
  lua_pushvalue(L, -1);
  setfenv(L);
  dooptions(L, loaded - 1);
  return 0;
}